

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  exception_ptr *this_00;
  rep rVar1;
  int64_t iVar2;
  element_type *peVar3;
  undefined8 uVar4;
  pointer *__ptr;
  int iVar5;
  int32_t i;
  long lVar6;
  exception_ptr exception;
  exception_ptr local_60;
  exception_ptr *local_58;
  exception_ptr local_50;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar1;
  LOCK();
  (this->tokenCount_).super___atomic_base<long>._M_i = 0;
  UNLOCK();
  LOCK();
  (this->loss_)._M_i = -1.0;
  UNLOCK();
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58 = &this->trainException_;
  std::__exception_ptr::exception_ptr::operator=(local_58,(exception_ptr *)&threads);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)&threads);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar5 = 0;
      iVar5 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->thread; iVar5 = iVar5 + 1) {
    local_60._M_exception_object = (void *)0x0;
    exception._M_exception_object = operator_new(0x18);
    *(undefined ***)exception._M_exception_object = &PTR___State_00158938;
    *(FastText **)((long)exception._M_exception_object + 8) = this;
    *(int *)((long)exception._M_exception_object + 0x10) = iVar5;
    std::thread::_M_start_thread(&local_60,&exception,0);
    if (exception._M_exception_object != (void *)0x0) {
      (**(code **)(*exception._M_exception_object + 8))();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              (&threads,(thread *)&local_60);
    std::thread::~thread((thread *)&local_60);
  }
  iVar2 = Dictionary::ntokens((this->dict_).
                              super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  while ((peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,
         (this->tokenCount_).super___atomic_base<long>._M_i < peVar3->epoch * iVar2 &&
         ((this->trainException_)._M_exception_object == (void *)0x0))) {
    exception._M_exception_object = (void *)0x64;
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&exception);
    if ((0.0 <= (this->loss_)._M_i) &&
       (1 < ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            verbose)) {
      lVar6 = (this->tokenCount_).super___atomic_base<long>._M_i;
      iVar5 = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->epoch;
      std::operator<<((ostream *)&std::cerr,"\r");
      printInfo(this,(float)lVar6 / (float)(iVar5 * iVar2),(this->loss_)._M_i,(ostream *)&std::cerr)
      ;
    }
  }
  for (lVar6 = 0; this_00 = local_58, lVar6 < peVar3->thread; lVar6 = lVar6 + 1) {
    std::thread::join();
    peVar3 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  if (local_58->_M_exception_object == (void *)0x0) {
    if (0 < peVar3->verbose) {
      std::operator<<((ostream *)&std::cerr,"\r");
      printInfo(this,1.0,(this->loss_)._M_i,(ostream *)&std::cerr);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    return;
  }
  std::__exception_ptr::exception_ptr::exception_ptr(&exception,local_58);
  local_60._M_exception_object = (void *)0x0;
  std::__exception_ptr::exception_ptr::operator=(this_00,&local_60);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_60);
  std::__exception_ptr::exception_ptr::exception_ptr(&local_50,&exception);
  uVar4 = std::rethrow_exception((exception_ptr)&local_50);
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_50);
  std::__exception_ptr::exception_ptr::~exception_ptr(&exception);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  _Unwind_Resume(uVar4);
}

Assistant:

void FastText::startThreads() {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  trainException_ = nullptr;
  std::vector<std::thread> threads;
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (keepTraining(ntokens)) {
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < args_->thread; i++) {
    threads[i].join();
  }
  if (trainException_) {
    std::exception_ptr exception = trainException_;
    trainException_ = nullptr;
    std::rethrow_exception(exception);
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}